

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_expression.cpp
# Opt level: O3

bool __thiscall
duckdb::BoundFunctionExpression::Equals(BoundFunctionExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  BoundFunctionExpression *pBVar2;
  
  bVar1 = BaseExpression::Equals((BaseExpression *)this,other_p);
  if (bVar1) {
    bVar1 = LogicalType::operator==
                      (&(this->super_Expression).return_type,(LogicalType *)(other_p + 1));
    if (bVar1) {
      pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(other_p);
      bVar1 = ScalarFunction::operator!=(&pBVar2->function,&this->function);
      if (!bVar1) {
        bVar1 = Expression::ListEquals(&this->children,&pBVar2->children);
        if (bVar1) {
          bVar1 = FunctionData::Equals
                            ((this->bind_info).
                             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
                             (pBVar2->bind_info).
                             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool BoundFunctionExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundFunctionExpression>();
	if (other.function != function) {
		return false;
	}
	if (!Expression::ListEquals(children, other.children)) {
		return false;
	}
	if (!FunctionData::Equals(bind_info.get(), other.bind_info.get())) {
		return false;
	}
	return true;
}